

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeLinkImplementationLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkImplementation *impl,
          cmGeneratorTarget *head,LinkInterfaceFor implFor)

{
  pointer ppVar1;
  cmGeneratorTarget *pcVar2;
  undefined8 this_00;
  bool bVar3;
  __type _Var4;
  PolicyStatus PVar5;
  cmTargetLinkLibraryType cVar6;
  string *psVar7;
  cmTarget *this_01;
  cmSourceFile *this_02;
  ostream *poVar8;
  cmake *pcVar9;
  cmValue cVar10;
  _Rb_tree_node_base *p_Var11;
  LinkLibraryVectorType *pLVar12;
  PolicyID id;
  _Rb_tree_node_base *p_Var13;
  long lVar14;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __rhs;
  __normal_iterator<cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  __it;
  pointer item_00;
  cmLinkImplItem *pcVar15;
  __normal_iterator<cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  _Var16;
  MessageType t;
  cmLinkImplItem *item_1;
  cmGeneratorTarget *__args;
  long lVar17;
  const_iterator __first;
  cmBTStringRange cVar18;
  string_view arg;
  bool checkCMP0027;
  cmLinkImplItem *local_3e8;
  vector<cmLinkImplItem,std::allocator<cmLinkImplItem>> *local_3e0;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string name_1;
  cmLocalGenerator *lg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_358;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *local_340;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_338;
  string *local_330;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_328;
  cmMakefile *local_320;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_318;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  *local_310;
  undefined1 local_308 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  cmGeneratorExpression ge;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_2c8;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  cmGeneratorExpressionDAGChecker dagChecker;
  string local_208 [32];
  string local_1e8;
  cmLinkItem item;
  _Rb_tree_node_base local_170;
  size_t local_150;
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  float local_128;
  size_t local_120;
  __node_base_ptr ap_Stack_118 [25];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lg = this->LocalGenerator;
  local_320 = lg->Makefile;
  cVar18 = cmTarget::GetLinkImplementationEntries_abi_cxx11_(this->Target);
  local_330 = &this->LinkerLanguage;
  local_340 = &(impl->super_cmLinkImplementation).super_cmLinkImplementationLibraries.Objects;
  local_338 = &this->MaxLanguageStandards;
  local_3e0 = (vector<cmLinkImplItem,std::allocator<cmLinkImplItem>> *)impl;
  while( true ) {
    local_328 = cVar18.End._M_current;
    __rhs = cVar18.Begin._M_current;
    if (__rhs._M_current == local_328._M_current) break;
    llibs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    llibs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    llibs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"LINK_LIBRARIES",(allocator<char> *)&item);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,this,&local_1e8,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_1e8);
    if ((implFor == Usage) && (PVar5 = GetPolicyStatusCMP0131(this), PVar5 - NEW < 3)) {
      dagChecker.TransitivePropertiesOnly = true;
    }
    local_310 = (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 *)&(__rhs._M_current)->Backtrace;
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_2b8,local_310);
    cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&local_2b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b8._M_refcount);
    std::__cxx11::string::string(local_208,(string *)__rhs._M_current);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
    std::__cxx11::string::~string(local_208);
    *(undefined1 *)
     ((long)cge._M_t.
            super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl + 0x49) = 1;
    psVar7 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        cge._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                        this->LocalGenerator,config,head,&dagChecker,(cmGeneratorTarget *)0x0,
                        local_330);
    checkCMP0027 = std::operator!=(psVar7,&(__rhs._M_current)->Value);
    arg._M_str = (psVar7->_M_dataplus)._M_p;
    arg._M_len = psVar7->_M_string_length;
    cmExpandList(arg,&llibs,false);
    if (*(char *)((long)cge._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl
                 + 0x131) == '\x01') {
      local_3e0[0xa3] = (vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>)0x1;
    }
    if (*(char *)((long)cge._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl
                 + 0x130) == '\x01') {
      local_3e0[0x48] = (vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>)0x1;
    }
    if (*(char *)((long)cge._M_t.
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl
                 + 0x132) == '\x01') {
      local_3e0[0xa0] = (vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>)0x1;
    }
    local_3e8 = (cmLinkImplItem *)
                llibs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_318 = __rhs._M_current;
    for (pcVar15 = (cmLinkImplItem *)
                   llibs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pcVar15 != local_3e8;
        pcVar15 = (cmLinkImplItem *)&(pcVar15->super_cmLinkItem).Target) {
      bVar3 = IsLinkLookupScope(this,(string *)pcVar15,&lg);
      if (!bVar3) {
        CheckCMP0004((string *)&debugConfigs,this,(string *)pcVar15);
        PVar5 = GetPolicyStatusCMP0108(this);
        if ((PVar5 == NEW) &&
           (this_01 = cmMakefile::FindTargetToUse(this->Makefile,(string *)&debugConfigs,false),
           this_01 != (cmTarget *)0x0)) {
          cmTarget::GetName_abi_cxx11_(this_01);
          std::__cxx11::string::_M_assign((string *)&debugConfigs);
        }
        psVar7 = GetName_abi_cxx11_(this);
        _Var4 = std::operator==((string *)&debugConfigs,psVar7);
        if ((_Var4) ||
           (debugConfigs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0)) {
          psVar7 = GetName_abi_cxx11_(this);
          _Var4 = std::operator==((string *)&debugConfigs,psVar7);
          if (_Var4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&item);
            PVar5 = GetPolicyStatusCMP0038(this);
            if (PVar5 != OLD) {
              t = FATAL_ERROR;
              if (PVar5 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_(&name_1,(cmPolicies *)0x26,id);
                poVar8 = std::operator<<((ostream *)&item,(string *)&name_1);
                std::operator<<(poVar8,"\n");
                std::__cxx11::string::~string((string *)&name_1);
                t = AUTHOR_WARNING;
              }
              poVar8 = std::operator<<((ostream *)&item,"Target \"");
              psVar7 = GetName_abi_cxx11_(this);
              poVar8 = std::operator<<(poVar8,(string *)psVar7);
              std::operator<<(poVar8,"\" links to itself.");
              pcVar9 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
              std::__cxx11::stringbuf::str();
              GetBacktrace((cmGeneratorTarget *)local_308);
              cmake::IssueMessage(pcVar9,t,&name_1,(cmListFileBacktrace *)local_308);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_308 + 8));
              std::__cxx11::string::~string((string *)&name_1);
              if (PVar5 != WARN) {
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&item);
                std::__cxx11::string::~string((string *)&debugConfigs);
                goto LAB_0034c680;
              }
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&item);
          }
        }
        else {
          std::__cxx11::string::string((string *)&local_50,(string *)&debugConfigs);
          std::
          __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr(&local_2c8,local_310);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                    ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&name_1,&local_50,(cmListFileBacktrace *)&local_2c8);
          ResolveLinkItem(&item,this,
                          (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&name_1,lg);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&name_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c8._M_refcount);
          std::__cxx11::string::~string((string *)&local_50);
          if (item.Target == (cmGeneratorTarget *)0x0) {
            psVar7 = cmLinkItem::AsStr_abi_cxx11_(&item);
            bVar3 = cmsys::SystemTools::FileIsFullPath(psVar7);
            if ((!bVar3) ||
               (this_02 = cmMakefile::GetSource(local_320,psVar7,Known),
               this_02 == (cmSourceFile *)0x0)) goto LAB_0034c5ed;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&name_1,"EXTERNAL_OBJECT",(allocator<char> *)local_308);
            bVar3 = cmSourceFile::GetPropertyAsBool(this_02,&name_1);
            std::__cxx11::string::~string((string *)&name_1);
            if (!bVar3) goto LAB_0034c5ed;
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      (local_340,&item);
          }
          else {
LAB_0034c5ed:
            std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>::
            emplace_back<cmLinkItem,bool_const&>(local_3e0,&item,&checkCMP0027);
          }
          cmLinkItem::~cmLinkItem(&item);
        }
        std::__cxx11::string::~string((string *)&debugConfigs);
      }
    }
    p_Var13 = (_Rb_tree_node_base *)
              ((long)cge._M_t.
                     super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                     .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl +
              0xb8);
    for (p_Var11 = *(_Rb_tree_node_base **)
                    ((long)cge._M_t.
                           super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                           .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                           _M_head_impl + 200); p_Var11 != p_Var13;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      cVar10 = GetProperty(this,(string *)(p_Var11 + 1));
      if (cVar10.Value == (string *)0x0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->LinkImplicitNullProperties,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var11 + 1));
      }
    }
    cmCompiledGeneratorExpression::GetMaxLanguageStandard
              ((cmCompiledGeneratorExpression *)
               cge._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,this,
               local_338);
LAB_0034c680:
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&llibs);
    cVar18.End._M_current = local_328._M_current;
    cVar18.Begin._M_current = local_318 + 1;
    if (pcVar15 != local_3e8) {
      return;
    }
  }
  if (head != this) goto LAB_0034c985;
  item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&item.Cross;
  item.String.field_2._8_8_ = local_3e0;
  item.Cross = false;
  item._41_3_ = 0;
  item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_170._M_left = &local_170;
  local_170._M_color = _S_red;
  local_170._M_parent = (_Base_ptr)0x0;
  local_150 = 0;
  local_148._M_p = (pointer)ap_Stack_118;
  local_140 = 1;
  local_138._M_allocated_capacity = 0;
  local_138._8_8_ = 0;
  local_128 = 1.0;
  local_120 = 0;
  ap_Stack_118[0] = (__node_base_ptr)0x0;
  dagChecker.Parent = *(cmGeneratorExpressionDAGChecker **)local_3e0;
  dagChecker.Target = *(cmGeneratorTarget **)(local_3e0 + 8);
  dagChecker.Property._M_dataplus._M_p = *(pointer *)(local_3e0 + 0x10);
  *(undefined8 *)local_3e0 = 0;
  *(pointer *)(local_3e0 + 8) = (pointer)0x0;
  *(pointer *)(local_3e0 + 0x10) = (pointer)0x0;
  item.String._M_dataplus._M_p = (pointer)this;
  item.String._M_string_length = (size_type)config;
  item.String.field_2._M_allocated_capacity._0_4_ = implFor;
  local_170._M_right = local_170._M_left;
  std::
  _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
  ::
  _M_insert_range_unique<__gnu_cxx::__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>>
            ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
              *)&item.Target,
             (__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
              )dagChecker.Parent,
             (__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
              )dagChecker.Target);
  pcVar2 = dagChecker.Target;
  name_1._M_dataplus._M_p = (pointer)&item;
  for (__args = (cmGeneratorTarget *)dagChecker.Parent; this_00 = item.String.field_2._8_8_,
      __args != pcVar2;
      __args = (cmGeneratorTarget *)&(__args->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header) {
    anon_unknown.dwarf_1082924::TransitiveLinkImpl::Follow
              ((TransitiveLinkImpl *)name_1._M_dataplus._M_p,
               (cmGeneratorTarget *)
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&__args->ObjectDirectory)->_M_allocated_capacity);
    std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::emplace_back<cmLinkImplItem>
              ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)item.String.field_2._8_8_,
               (cmLinkImplItem *)__args);
  }
  __it._M_current = *(cmLinkImplItem **)item.String.field_2._8_8_;
  local_3e8 = *(cmLinkImplItem **)(item.String.field_2._8_8_ + 8);
  lVar17 = (long)local_3e8 - (long)__it._M_current;
  debugConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)name_1._M_dataplus._M_p;
  for (lVar14 = lVar17 / 0x48 >> 2; pcVar15 = local_3e8, _Var16._M_current = __it._M_current,
      0 < lVar14; lVar14 = lVar14 + -1) {
    bVar3 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::__0> *)
                         &name_1,__it);
    pcVar15 = local_3e8;
    if (bVar3) goto LAB_0034c914;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::__0> *)
                         &name_1,__it._M_current + 1);
    _Var16._M_current = __it._M_current + 1;
    pcVar15 = local_3e8;
    if (bVar3) goto LAB_0034c914;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::__0> *)
                         &name_1,__it._M_current + 2);
    _Var16._M_current = __it._M_current + 2;
    pcVar15 = local_3e8;
    if (bVar3) goto LAB_0034c914;
    bVar3 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::__0> *)
                         &name_1,__it._M_current + 3);
    _Var16._M_current = __it._M_current + 3;
    pcVar15 = local_3e8;
    if (bVar3) goto LAB_0034c914;
    __it._M_current = __it._M_current + 4;
    lVar17 = lVar17 + -0x120;
  }
  lVar17 = lVar17 / 0x48;
  if (lVar17 == 1) {
LAB_0034cafd:
    bVar3 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::__0> *)
                         &name_1,__it);
    _Var16._M_current = __it._M_current;
    if (!bVar3) {
      _Var16._M_current = pcVar15;
    }
LAB_0034c914:
    __first._M_current = _Var16._M_current;
    if (_Var16._M_current != pcVar15) {
      while (_Var16._M_current = _Var16._M_current + 1, _Var16._M_current != local_3e8) {
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::$_0>::operator()
                          ((_Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::__0> *)
                           &debugConfigs,_Var16);
        if (!bVar3) {
          cmLinkImplItem::operator=(__first._M_current,_Var16._M_current);
          __first._M_current = __first._M_current + 1;
        }
      }
    }
  }
  else {
    if (lVar17 == 2) {
LAB_0034c8ee:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::$_0>::operator()
                        ((_Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::__0> *)
                         &name_1,__it);
      _Var16._M_current = __it._M_current;
      if (!bVar3) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0034cafd;
      }
      goto LAB_0034c914;
    }
    __first._M_current = local_3e8;
    if (lVar17 == 3) {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::$_0>::operator()
                        ((_Iter_pred<(anonymous_namespace)::TransitiveLinkImpl::Compute()::__0> *)
                         &name_1,__it);
      if (!bVar3) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0034c8ee;
      }
      goto LAB_0034c914;
    }
  }
  std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::erase
            ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_00,__first,
             *(cmLinkImplItem **)(item.String.field_2._8_8_ + 8));
  std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::~vector
            ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)&dagChecker);
  anon_unknown.dwarf_1082924::TransitiveLinkImpl::~TransitiveLinkImpl((TransitiveLinkImpl *)&item);
LAB_0034c985:
  pcVar9 = cmMakefile::GetCMakeInstance(this->Makefile);
  cmake::GetDebugConfigs_abi_cxx11_(&debugConfigs,pcVar9);
  cVar6 = CMP0003_ComputeLinkType(config,&debugConfigs);
  local_3e8 = (cmLinkImplItem *)CONCAT44(local_3e8._4_4_,cVar6);
  pLVar12 = cmTarget::GetOriginalLinkLibraries_abi_cxx11_(this->Target);
  ppVar1 = (pLVar12->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_3e0 = local_3e0 + 0x30;
  for (item_00 = (pLVar12->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; item_00 != ppVar1;
      item_00 = item_00 + 1) {
    if ((item_00->second != GENERAL_LibraryType) &&
       (item_00->second != (cmTargetLinkLibraryType)local_3e8)) {
      CheckCMP0004(&name_1,this,&item_00->first);
      psVar7 = GetName_abi_cxx11_(this);
      _Var4 = std::operator==(&name_1,psVar7);
      if ((!_Var4) && (name_1._M_string_length != 0)) {
        std::__cxx11::string::string((string *)&local_2a8,(string *)&name_1);
        local_358.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_358.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_358);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&dagChecker,&local_2a8,(cmListFileBacktrace *)&local_358);
        ResolveLinkItem(&item,this,
                        (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&dagChecker);
        std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                  ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_3e0,&item);
        cmLinkItem::~cmLinkItem(&item);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&dagChecker);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_358.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::string::~string((string *)&local_2a8);
      }
      std::__cxx11::string::~string((string *)&name_1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugConfigs);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkImplementationLibraries(
  const std::string& config, cmOptionalLinkImplementation& impl,
  cmGeneratorTarget const* head, LinkInterfaceFor implFor) const
{
  cmLocalGenerator const* lg = this->LocalGenerator;
  cmMakefile const* mf = lg->GetMakefile();
  cmBTStringRange entryRange = this->Target->GetLinkImplementationEntries();
  // Collect libraries directly linked in this configuration.
  for (auto const& entry : entryRange) {
    std::vector<std::string> llibs;
    // Keep this logic in sync with ExpandLinkItems.
    cmGeneratorExpressionDAGChecker dagChecker(this, "LINK_LIBRARIES", nullptr,
                                               nullptr);
    // The $<LINK_ONLY> expression may be used to specify link dependencies
    // that are otherwise excluded from usage requirements.
    if (implFor == LinkInterfaceFor::Usage) {
      switch (this->GetPolicyStatusCMP0131()) {
        case cmPolicies::WARN:
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          dagChecker.SetTransitivePropertiesOnly();
          break;
      }
    }
    cmGeneratorExpression ge(entry.Backtrace);
    std::unique_ptr<cmCompiledGeneratorExpression> const cge =
      ge.Parse(entry.Value);
    cge->SetEvaluateForBuildsystem(true);
    std::string const& evaluated =
      cge->Evaluate(this->LocalGenerator, config, head, &dagChecker, nullptr,
                    this->LinkerLanguage);
    bool const checkCMP0027 = evaluated != entry.Value;
    cmExpandList(evaluated, llibs);
    if (cge->GetHadHeadSensitiveCondition()) {
      impl.HadHeadSensitiveCondition = true;
    }
    if (cge->GetHadContextSensitiveCondition()) {
      impl.HadContextSensitiveCondition = true;
    }
    if (cge->GetHadLinkLanguageSensitiveCondition()) {
      impl.HadLinkLanguageSensitiveCondition = true;
    }

    for (std::string const& lib : llibs) {
      if (this->IsLinkLookupScope(lib, lg)) {
        continue;
      }

      // Skip entries that resolve to the target itself or are empty.
      std::string name = this->CheckCMP0004(lib);
      if (this->GetPolicyStatusCMP0108() == cmPolicies::NEW) {
        // resolve alias name
        auto* target = this->Makefile->FindTargetToUse(name);
        if (target) {
          name = target->GetName();
        }
      }
      if (name == this->GetName() || name.empty()) {
        if (name == this->GetName()) {
          bool noMessage = false;
          MessageType messageType = MessageType::FATAL_ERROR;
          std::ostringstream e;
          switch (this->GetPolicyStatusCMP0038()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
              break;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }

          if (!noMessage) {
            e << "Target \"" << this->GetName() << "\" links to itself.";
            this->LocalGenerator->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), this->GetBacktrace());
            if (messageType == MessageType::FATAL_ERROR) {
              return;
            }
          }
        }
        continue;
      }

      // The entry is meant for this configuration.
      cmLinkItem item =
        this->ResolveLinkItem(BT<std::string>(name, entry.Backtrace), lg);
      if (!item.Target) {
        // Report explicitly linked object files separately.
        std::string const& maybeObj = item.AsStr();
        if (cmSystemTools::FileIsFullPath(maybeObj)) {
          cmSourceFile const* sf =
            mf->GetSource(maybeObj, cmSourceFileLocationKind::Known);
          if (sf && sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
            impl.Objects.emplace_back(std::move(item));
            continue;
          }
        }
      }

      impl.Libraries.emplace_back(std::move(item), checkCMP0027);
    }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::string const& sp : seenProps) {
      if (!this->GetProperty(sp)) {
        this->LinkImplicitNullProperties.insert(sp);
      }
    }
    cge->GetMaxLanguageStandard(this, this->MaxLanguageStandards);
  }

  // Update the list of direct link dependencies from usage requirements.
  if (head == this) {
    ComputeLinkImplTransitive(this, config, implFor, impl);
  }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();

  cmTargetLinkLibraryType linkType =
    CMP0003_ComputeLinkType(config, debugConfigs);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    this->Target->GetOriginalLinkLibraries();
  for (cmTarget::LibraryID const& oldllib : oldllibs) {
    if (oldllib.second != GENERAL_LibraryType && oldllib.second != linkType) {
      std::string name = this->CheckCMP0004(oldllib.first);
      if (name == this->GetName() || name.empty()) {
        continue;
      }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        this->ResolveLinkItem(BT<std::string>(name)));
    }
  }
}